

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

ecs_entity_t
ecs_type_contains(ecs_world_t *world,ecs_type_t type_1,ecs_type_t type_2,_Bool match_all,
                 _Bool match_prefab)

{
  int32_t iVar1;
  uint uVar2;
  ecs_entity_t *peVar3;
  void *pvVar4;
  long lVar5;
  ecs_entity_t eVar6;
  ulong component;
  ulong uVar7;
  char *__assertion;
  int iVar8;
  ulong uVar9;
  ecs_world_t *world_local;
  ulong local_48;
  ecs_type_t local_40;
  void *local_38;
  
  world_local = world;
  _ecs_assert(world != (ecs_world_t *)0x0,0xc,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/type.c"
              ,0x3b);
  if (world == (ecs_world_t *)0x0) {
    __assertion = "world != ((void*)0)";
    uVar2 = 0x3b;
  }
  else {
    ecs_get_stage(&world_local);
    if (type_1 == (ecs_type_t)0x0) {
      return 0;
    }
    _ecs_assert(type_2 != (ecs_type_t)0x0,0xc,(char *)0x0,"type_2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/type.c"
                ,0x42);
    if (type_2 == (ecs_type_t)0x0) {
      __assertion = "type_2 != ((void*)0)";
      uVar2 = 0x42;
    }
    else {
      peVar3 = (ecs_entity_t *)_ecs_vector_first(type_1,8,0x10);
      if (type_1 == type_2) {
        return *peVar3;
      }
      pvVar4 = _ecs_vector_first(type_2,8,0x10);
      _ecs_assert(peVar3 != (ecs_entity_t *)0x0,0xc,(char *)0x0,"t1_array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x4d);
      if (peVar3 == (ecs_entity_t *)0x0) {
        __assertion = "t1_array != ((void*)0)";
        uVar2 = 0x4d;
      }
      else {
        _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"t2_array != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/type.c"
                    ,0x4e);
        if (pvVar4 != (void *)0x0) {
          local_40 = type_1;
          local_38 = pvVar4;
          iVar1 = ecs_vector_count(type_1);
          uVar2 = ecs_vector_count(type_2);
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          local_48 = (ulong)uVar2;
          uVar9 = 0;
          component = 0;
          iVar8 = 0;
          while( true ) {
            if (uVar9 == local_48) {
              if (match_all) {
                return component;
              }
              return 0;
            }
            if (iVar1 <= iVar8) break;
            component = *(ulong *)((long)local_38 + uVar9 * 8);
            lVar5 = (long)iVar8;
            uVar7 = peVar3[lVar5];
            while (uVar7 < component) {
              lVar5 = lVar5 + 1;
              if (iVar1 <= lVar5) {
                return 0;
              }
              iVar8 = iVar8 + 1;
              uVar7 = peVar3[lVar5];
            }
            if (uVar7 == component) {
              if (!match_all) {
                return component;
              }
              iVar8 = iVar8 + 1;
              if (iVar8 < iVar1) {
                component = peVar3[iVar8];
              }
            }
            else {
              if ((((match_prefab) && (component != 6)) && (component != 0x101)) &&
                 ((component != 0x103 &&
                  (eVar6 = ecs_find_entity_in_prefabs(world_local,0,local_40,component,0),
                  eVar6 != 0)))) {
                uVar7 = component;
              }
              if (uVar7 == component) {
                if (!match_all) {
                  return component;
                }
              }
              else {
                component = uVar7;
                if (match_all) {
                  return 0;
                }
              }
            }
            uVar9 = uVar9 + 1;
          }
          return 0;
        }
        __assertion = "t2_array != ((void*)0)";
        uVar2 = 0x4e;
        local_38 = (void *)0x0;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/type.c"
                ,uVar2,
                "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
               );
}

Assistant:

ecs_entity_t ecs_type_contains(
    ecs_world_t *world,
    ecs_type_t type_1,
    ecs_type_t type_2,
    bool match_all,
    bool match_prefab)
{
    ecs_assert(world != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_get_stage(&world);
    
    if (!type_1) {
        return 0;
    }

    ecs_assert(type_2 != NULL, ECS_INTERNAL_ERROR, NULL);

    if (type_1 == type_2) {
        return *(ecs_vector_first(type_1, ecs_entity_t));
    }

    int32_t i_2, i_1 = 0;
    ecs_entity_t e1 = 0;
    ecs_entity_t *t1_array = ecs_vector_first(type_1, ecs_entity_t);
    ecs_entity_t *t2_array = ecs_vector_first(type_2, ecs_entity_t);

    ecs_assert(t1_array != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(t2_array != NULL, ECS_INTERNAL_ERROR, NULL);

    int32_t t1_count = ecs_vector_count(type_1);
    int32_t t2_count = ecs_vector_count(type_2);

    for (i_2 = 0; i_2 < t2_count; i_2 ++) {
        ecs_entity_t e2 = t2_array[i_2];

        if (i_1 >= t1_count) {
            return 0;
        }

        e1 = t1_array[i_1];

        if (e2 > e1) {
            do {
                i_1 ++;
                if (i_1 >= t1_count) {
                    return 0;
                }
                e1 = t1_array[i_1];
            } while (e2 > e1);
        }

        if (e1 != e2) {
            if (match_prefab && e2 != 
                ecs_typeid(EcsName) && e2 != 
                EcsPrefab && e2 != 
                EcsDisabled) 
            {
                if (ecs_find_entity_in_prefabs(world, 0, type_1, e2, 0)) {
                    e1 = e2;
                }
            }

            if (e1 != e2) {
                if (match_all) return 0;
            } else if (!match_all) {
                return e1;
            }
        } else {
            if (!match_all) return e1;
            i_1 ++;
            if (i_1 < t1_count) {
                e1 = t1_array[i_1];
            }
        }
    }

    if (match_all) {
        return e1;
    } else {
        return 0;
    }
}